

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall kj::Vector<char>::addAll<kj::String>(Vector<char> *this,String *container)

{
  char *begin;
  size_t sVar1;
  char *end;
  
  begin = (container->content).ptr;
  sVar1 = (container->content).size_;
  end = begin + (sVar1 - 1);
  if (sVar1 == 0) {
    end = (char *)0x0;
    begin = (char *)0x0;
  }
  addAll<char*>(this,begin,end);
  return;
}

Assistant:

inline void addAll(Container&& container) {
    addAll(container.begin(), container.end());
  }